

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::vertex_attrib_i_pointer(NegativeTestContext *ctx)

{
  GLuint index;
  GLbyte offset;
  GLuint vao;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"GL_INVALID_ENUM is generated if type is not an accepted value.",
             (allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribIPointer(&ctx->super_CallLogWrapper,0,1,0,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glVertexAttribIPointer(&ctx->super_CallLogWrapper,0,4,0x8d9f,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glVertexAttribIPointer(&ctx->super_CallLogWrapper,0,4,0x8368,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,(allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  index = NegativeTestContext::getInteger(ctx,0x8869);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&ctx->super_CallLogWrapper,index,1,0x1400,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"GL_INVALID_VALUE is generated if size is not 1, 2, 3, or 4.",
             (allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribIPointer(&ctx->super_CallLogWrapper,0,0,0x1400,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"GL_INVALID_VALUE is generated if stride is negative.",
             (allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribIPointer(&ctx->super_CallLogWrapper,0,1,0x1400,-1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,
             "GL_INVALID_OPERATION is generated a non-zero vertex array object is bound, zero is bound to the GL_ARRAY_BUFFER buffer object binding point and the pointer argument is not NULL."
             ,(allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  vao = 0;
  offset = '\x01';
  glu::CallLogWrapper::glGenVertexArrays(&ctx->super_CallLogWrapper,1,&vao);
  glu::CallLogWrapper::glBindVertexArray(&ctx->super_CallLogWrapper,vao);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8892,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glVertexAttribIPointer(&ctx->super_CallLogWrapper,0,1,0x1400,0,&offset);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindVertexArray(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteVertexArrays(&ctx->super_CallLogWrapper,1,&vao);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attrib_i_pointer (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if type is not an accepted value.");
	ctx.glVertexAttribIPointer(0, 1, 0, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glVertexAttribIPointer(0, 4, GL_INT_2_10_10_10_REV, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glVertexAttribIPointer(0, 4, GL_UNSIGNED_INT_2_10_10_10_REV, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	ctx.glVertexAttribIPointer(maxVertexAttribs, 1, GL_BYTE, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if size is not 1, 2, 3, or 4.");
	ctx.glVertexAttribIPointer(0, 0, GL_BYTE, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if stride is negative.");
	ctx.glVertexAttribIPointer(0, 1, GL_BYTE, -1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated a non-zero vertex array object is bound, zero is bound to the GL_ARRAY_BUFFER buffer object binding point and the pointer argument is not NULL.");
	GLuint vao = 0;
	GLbyte offset = 1;
	ctx.glGenVertexArrays(1, &vao);
	ctx.glBindVertexArray(vao);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.expectError(GL_NO_ERROR);

	ctx.glVertexAttribIPointer(0, 1, GL_BYTE, 0, &offset);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindVertexArray(0);
	ctx.glDeleteVertexArrays(1, &vao);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}